

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usertimer.cpp
# Opt level: O0

void __thiscall soplex::UserTimer::updateTicks(UserTimer *this)

{
  clock_t cVar1;
  long in_RDI;
  clock_t ret;
  tms now;
  tms local_28;
  
  cVar1 = times(&local_28);
  if ((int)cVar1 == -1) {
    local_28.tms_utime = 0;
  }
  *(clock_t *)(in_RDI + 0x18) = local_28.tms_utime;
  return;
}

Assistant:

void UserTimer::updateTicks() const
{
#if defined(_WIN32) || defined(_WIN64)

   uTicks = clock();

#else   /* !(_WIN32 || _WIN64) */

   struct tms now;
   clock_t    ret = times(&now);

   if(int(ret) == -1)
      now.tms_utime = now.tms_stime = ret = 0;

   uTicks = now.tms_utime;

#endif  /* !(_WIN32 || _WIN64) */
}